

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t helper_sub64_ssov(CPUTriCoreState *env,uint64_t r1,uint64_t r2)

{
  int64_t ovf;
  uint64_t result;
  uint64_t r2_local;
  uint64_t r1_local;
  CPUTriCoreState *env_local;
  
  ovf = r1 - r2;
  env->PSW_USB_AV = (uint)((ulong)ovf >> 0x20) ^ (uint)((ulong)(ovf * 2) >> 0x20);
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  if ((long)((ovf ^ r1) & (r1 ^ r2)) < 0) {
    env->PSW_USB_V = 0x80000000;
    env->PSW_USB_SV = 0x80000000;
    if ((long)r1 < 0) {
      ovf = -0x8000000000000000;
    }
    else {
      ovf = 0x7fffffffffffffff;
    }
  }
  else {
    env->PSW_USB_V = 0;
  }
  return ovf;
}

Assistant:

uint64_t helper_sub64_ssov(CPUTriCoreState *env, uint64_t r1, uint64_t r2)
{
    uint64_t result;
    int64_t ovf;

    result = r1 - r2;
    ovf = (result ^ r1) & (r1 ^ r2);
    env->PSW_USB_AV = (result ^ result * 2u) >> 32;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    if (ovf < 0) {
        env->PSW_USB_V = (1 << 31);
        env->PSW_USB_SV = (1 << 31);
        /* ext_ret > MAX_INT */
        if ((int64_t)r1 >= 0) {
            result = INT64_MAX;
        /* ext_ret < MIN_INT */
        } else {
            result = INT64_MIN;
        }
    } else {
        env->PSW_USB_V = 0;
    }
    return result;
}